

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int PatchFrame(int frameNum)

{
  ushort uVar1;
  uint uVar2;
  char *__s1;
  int iVar3;
  uint statenum;
  FState *pFVar4;
  size_t sVar5;
  FState *pFVar6;
  ulong uVar7;
  spritedef_t *psVar8;
  uint uVar9;
  uint uVar10;
  FState dummy;
  uint local_60;
  uint local_5c;
  FState local_58;
  
  pFVar4 = FindState(frameNum);
  if (pFVar4 == (FState *)0x0) {
    uVar9 = 0;
    Printf("Frame %d out of range\n",frameNum);
    pFVar4 = &local_58;
    local_60 = 0;
    local_5c = 0;
  }
  else {
    DPrintf(4,"Frame %d\n",frameNum);
    if (frameNum == 0x2f) {
      local_5c = 5;
    }
    else if (frameNum == 0x30) {
      local_5c = 4;
    }
    else {
      uVar1 = pFVar4->Tics;
      local_5c = (uint)uVar1;
      if (pFVar4->TicRange != 0) {
        uVar9 = FRandom::GenRand32(&FState::pr_statetics);
        local_5c = (uint)uVar1 + uVar9 % (pFVar4->TicRange + 1);
      }
    }
    local_60 = pFVar4->Misc1;
    uVar9 = (pFVar4->StateFlags & 4) << 0xd | (uint)pFVar4->Frame;
  }
  iVar3 = GetLine();
  uVar2 = local_60;
  do {
    if (iVar3 != 1) {
      if (pFVar4 != &local_58) {
        *(byte *)&pFVar4->StateFlags = (byte)pFVar4->StateFlags | 0x40;
        if ((uVar9 & 0x7fc0) != 0) {
          Printf("Frame %d: Subnumber must be in range [0,63]\n",frameNum);
        }
        pFVar4->Tics = (int16_t)local_5c;
        pFVar4->Misc1 = uVar2;
        pFVar4->Frame = (byte)uVar9 & 0x3f;
        pFVar4->StateFlags = (ushort)(uVar9 >> 0xd) & 4 | pFVar4->StateFlags & 0xfffb;
      }
      return iVar3;
    }
    statenum = atoi(Line2);
    __s1 = Line1;
    sVar5 = strlen(Line1);
    uVar10 = uVar9;
    local_60 = uVar2;
    switch(sVar5) {
    case 8:
      iVar3 = strcasecmp(__s1,"Duration");
      if (iVar3 != 0) goto switchD_003641d5_caseD_b;
      if (0x7ffe < (int)statenum) {
        statenum = 0x7fff;
      }
      local_5c = statenum;
      if ((int)statenum < 0) {
        local_5c = 0xffffffff;
      }
      break;
    case 9:
      iVar3 = strcasecmp(__s1,"Unknown 1");
      local_60 = statenum;
      if (iVar3 != 0) {
        iVar3 = strcasecmp(__s1,"Unknown 2");
        if (iVar3 != 0) goto switchD_003641d5_caseD_b;
        pFVar4->Misc2 = statenum;
        local_60 = uVar2;
      }
      break;
    case 10:
      iVar3 = strcasecmp(__s1,"Next frame");
      if (iVar3 != 0) goto switchD_003641d5_caseD_b;
      pFVar6 = FindState(statenum);
      pFVar4->NextState = pFVar6;
      break;
    default:
switchD_003641d5_caseD_b:
      Printf("Unknown key %s encountered in %s %d.\n",__s1,"Frame",frameNum);
      uVar10 = uVar9;
      local_60 = uVar2;
      break;
    case 0xd:
      iVar3 = strcasecmp(__s1,"Sprite number");
      if (iVar3 != 0) goto switchD_003641d5_caseD_b;
      if ((int)statenum < (int)OrgSprNames.Count) {
        if ((ulong)sprites.Count == 0) {
          uVar7 = 0;
LAB_00364329:
          if ((uint)uVar7 != sprites.Count) break;
        }
        else {
          uVar7 = 0;
          psVar8 = sprites.Array;
          do {
            if (*(DWORD *)OrgSprNames.Array[(int)statenum].c == (psVar8->field_0).dwName) {
              pFVar4->sprite = (int32_t)uVar7;
              goto LAB_00364329;
            }
            uVar7 = uVar7 + 1;
            psVar8 = psVar8 + 1;
          } while (sprites.Count != uVar7);
        }
        Printf("Frame %d: Sprite %d (%s) is undefined\n",frameNum,(ulong)statenum,
               OrgSprNames.Array + (int)statenum);
      }
      else {
        Printf("Frame %d: Sprite %d out of range\n",frameNum,(ulong)statenum);
      }
      break;
    case 0x10:
      iVar3 = strcasecmp(__s1,"Sprite subnumber");
      uVar10 = statenum;
      if (iVar3 != 0) goto switchD_003641d5_caseD_b;
    }
    iVar3 = GetLine();
    uVar9 = uVar10;
    uVar2 = local_60;
  } while( true );
}

Assistant:

static int PatchFrame (int frameNum)
{
	int result;
	int tics, misc1, frame;
	FState *info, dummy;

	info = FindState (frameNum);
	if (info)
	{
		DPrintf (DMSG_SPAMMY, "Frame %d\n", frameNum);
		if (frameNum == 47)
		{ // Use original tics for S_DSGUNFLASH1
			tics = 5;
		}
		else if (frameNum == 48)
		{ // Ditto for S_DSGUNFLASH2
			tics = 4;
		}
		else
		{
			tics = info->GetTics ();
		}
		misc1 = info->GetMisc1 ();
		frame = info->GetFrame () | (info->GetFullbright() ? 0x8000 : 0);
	}
	else
	{
		info = &dummy;
		tics = misc1 = frame = 0;
		Printf ("Frame %d out of range\n", frameNum);
	}

	while ((result = GetLine ()) == 1)
	{
		int val = atoi (Line2);
		size_t keylen = strlen (Line1);

		if (keylen == 8 && stricmp (Line1, "Duration") == 0)
		{
			tics = clamp (val, -1, SHRT_MAX);
		}
		else if (keylen == 9 && stricmp (Line1, "Unknown 1") == 0)
		{
			misc1 = val;
		}
		else if (keylen == 9 && stricmp (Line1, "Unknown 2") == 0)
		{
			info->Misc2 = val;
		}
		else if (keylen == 13 && stricmp (Line1, "Sprite number") == 0)
		{
			unsigned int i;

			if (val < (int)OrgSprNames.Size())
			{
				for (i = 0; i < sprites.Size(); i++)
				{
					if (memcmp (OrgSprNames[val].c, sprites[i].name, 4) == 0)
					{
						info->sprite = (int)i;
						break;
					}
				}
				if (i == sprites.Size ())
				{
					Printf ("Frame %d: Sprite %d (%s) is undefined\n",
						frameNum, val, OrgSprNames[val].c);
				}
			}
			else
			{
				Printf ("Frame %d: Sprite %d out of range\n", frameNum, val);
			}
		}
		else if (keylen == 10 && stricmp (Line1, "Next frame") == 0)
		{
			info->NextState = FindState (val);
		}
		else if (keylen == 16 && stricmp (Line1, "Sprite subnumber") == 0)
		{
			frame = val;
		}
		else
		{
			Printf (unknown_str, Line1, "Frame", frameNum);
		}
	}

	if (info != &dummy)
	{
		info->StateFlags |= STF_DEHACKED;	// Signals the state has been modified by dehacked
		if ((unsigned)(frame & 0x7fff) > 63)
		{
			Printf("Frame %d: Subnumber must be in range [0,63]\n", frameNum);
		}
		info->Tics = tics;
		info->Misc1 = misc1;
		info->Frame = frame & 0x3f;
		if (frame & 0x8000) info->StateFlags |= STF_FULLBRIGHT;
		else info->StateFlags &= ~STF_FULLBRIGHT;
	}

	return result;
}